

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O3

cf_bool_t cf_str_strip(cf_char_t *s)

{
  byte bVar1;
  size_t sVar2;
  long lVar3;
  byte *pbVar4;
  ulong uVar5;
  
  if (s == (cf_char_t *)0x0) {
    return 0;
  }
  sVar2 = strlen(s);
  if (sVar2 != 0) {
    lVar3 = -sVar2;
    for (pbVar4 = (byte *)s; (bVar1 = *pbVar4, bVar1 - 9 < 2 || (bVar1 == 0x20));
        pbVar4 = pbVar4 + 1) {
      lVar3 = lVar3 + 1;
    }
    if (bVar1 != 0) {
      while( true ) {
        sVar2 = sVar2 - 1;
        if ((0x20 < (ulong)(byte)s[sVar2]) ||
           ((0x100000600U >> ((ulong)(byte)s[sVar2] & 0x3f) & 1) == 0)) break;
        lVar3 = lVar3 + 1;
      }
      if (lVar3 != 0) {
        uVar5 = 0;
        do {
          s[uVar5] = pbVar4[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar5 < (ulong)-lVar3);
      }
      s = s + -lVar3;
    }
    *s = '\0';
  }
  return 1;
}

Assistant:

cf_bool_t cf_str_strip(cf_char_t* s) {
    cf_char_t* start = CF_NULL_PTR;
    cf_char_t* end = CF_NULL_PTR;
    cf_size_t len = 0;
    cf_size_t i = 0;
    if (!s) return CF_FALSE;

    len = strlen(s);
    if (len == 0) return CF_TRUE;

    /* strip left */
    start = s;
    while (CF_IS_SPACE(*start)) {
        start++;
    }
    // all chars are \b or \t
    if (*start == '\0') {
        s[0] = '\0';
        return CF_TRUE;
    }

    /* strip right */
    end = s + len - 1;
    while (CF_IS_SPACE(*end)) {
        end--;
    }

    len = end - start + 1;    
    for (i = 0; i < len; i++) {
        s[i] = *(start + i);
    }
    s[len] = '\0';
    return CF_TRUE;
}